

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

char * Part_ManFetch(Part_Man_t *p,int nSize)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (nSize < 1) {
    __assert_fail("nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                  ,0x78,"char *Part_ManFetch(Part_Man_t *, int)");
  }
  uVar1 = (long)nSize % (long)p->nStepSize;
  iVar5 = (nSize / p->nStepSize + 1) - (uint)((int)uVar1 == 0);
  Vec_PtrFillExtra(p->vFree,iVar5 + 1,(void *)(uVar1 & 0xffffffff));
  pcVar2 = (char *)Vec_PtrEntry(p->vFree,iVar5);
  if (pcVar2 == (char *)0x0) {
    lVar4 = (long)iVar5 * (long)p->nStepSize;
    iVar5 = p->nFreeSize;
    iVar3 = (int)lVar4;
    if (iVar5 < iVar3) {
      iVar5 = p->nChunkSize;
      pcVar2 = (char *)malloc((long)iVar5);
      p->pFreeBuf = pcVar2;
      p->nFreeSize = iVar5;
      Vec_PtrPush(p->vMemory,pcVar2);
      iVar5 = p->nFreeSize;
    }
    if (iVar5 < iVar3) {
      __assert_fail("p->nFreeSize >= nSizeReal",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                    ,0x87,"char *Part_ManFetch(Part_Man_t *, int)");
    }
    pcVar2 = p->pFreeBuf;
    p->pFreeBuf = pcVar2 + lVar4;
    p->nFreeSize = iVar5 - iVar3;
  }
  else {
    Vec_PtrWriteEntry(p->vFree,iVar5,*(void **)pcVar2);
  }
  return pcVar2;
}

Assistant:

char * Part_ManFetch( Part_Man_t * p, int nSize )
{
    int Type, nSizeReal;
    char * pMemory;
    assert( nSize > 0 );
    Type = Part_SizeType( nSize, p->nStepSize );
    Vec_PtrFillExtra( p->vFree, Type + 1, NULL );
    if ( (pMemory = (char *)Vec_PtrEntry( p->vFree, Type )) )
    {
        Vec_PtrWriteEntry( p->vFree, Type, Part_OneNext(pMemory) );
        return pMemory;
    }
    nSizeReal = p->nStepSize * Type;
    if ( p->nFreeSize < nSizeReal )
    {
        p->pFreeBuf = ABC_ALLOC( char, p->nChunkSize );
        p->nFreeSize = p->nChunkSize;
        Vec_PtrPush( p->vMemory, p->pFreeBuf );
    }
    assert( p->nFreeSize >= nSizeReal );
    pMemory = p->pFreeBuf;
    p->pFreeBuf  += nSizeReal;
    p->nFreeSize -= nSizeReal;
    return pMemory;
}